

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

int test_exts(void)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  char cVar4;
  uint32_t i;
  long lVar5;
  char *s1;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  int8_t ext_type;
  char *d2;
  long *local_50;
  uint32_t len2;
  char *d3;
  char *d4;
  
  _plan(0xec,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_exts");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x01",0xc,1,_stdout);
  fputc(10,_stdout);
  str[0] = 'a';
  ext_type = '\0';
  buf[1] = 0xd4;
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 1),"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_decode_ext(x, %u))",1);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 1),"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_decode_strbin(x, %u))",1);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 1);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x01)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "mp_check_ext(mp_encode_ext(x, 0x01))");
  _ok((uint)(d2 == buf + 4),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_decode_ext(x, 0x01)");
  _ok((uint)(d3 == buf + 4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_next_ext(x, 0x01)");
  _ok((uint)(d4 == buf + 4),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_check_ext(x, 0x01)");
  uVar2 = mp_sizeof_ext(1);
  _ok((uint)(uVar2 == 3),"mp_sizeof_ext(0x01) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "mp_sizeof_ext(0x01)");
  _ok((uint)(str[0] == (char)*local_50),"memcmp(s1, s2, 0x01) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "mp_encode_ext(x, 0x01) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x02",0xc,1,_stdout);
  fputc(10,_stdout);
  str[0] = 'a';
  str[1] = 'b';
  ext_type = '\0';
  buf[1] = 0xd5;
  buf[2] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 2),"0x02 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_decode_ext(x, %u))",2);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 2),"0x02 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_decode_strbin(x, %u))",2);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 2);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x02)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "mp_check_ext(mp_encode_ext(x, 0x02))");
  _ok((uint)(d2 == buf + 5),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_decode_ext(x, 0x02)");
  _ok((uint)(d3 == buf + 5),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_next_ext(x, 0x02)");
  _ok((uint)(d4 == buf + 5),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "len(mp_check_ext(x, 0x02)");
  uVar2 = mp_sizeof_ext(2);
  _ok((uint)(uVar2 == 4),"mp_sizeof_ext(0x02) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "mp_sizeof_ext(0x02)");
  _ok((uint)(CONCAT11(str[1],str[0]) == (short)*local_50),"memcmp(s1, s2, 0x02) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x253,
      "mp_encode_ext(x, 0x02) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x03",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\x03';
  buf[1] = -0x39;
  buf[3] = '\0';
  buf[6] = str[2];
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 3),"0x03 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_decode_ext(x, %u))",3);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 3),"0x03 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_decode_strbin(x, %u))",3);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 3);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x03)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "mp_check_ext(mp_encode_ext(x, 0x03))");
  _ok((uint)(d2 == buf + 7),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_decode_ext(x, 0x03)");
  _ok((uint)(d3 == buf + 7),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_next_ext(x, 0x03)");
  _ok((uint)(d4 == buf + 7),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "len(mp_check_ext(x, 0x03)");
  uVar2 = mp_sizeof_ext(3);
  _ok((uint)(uVar2 == 6),"mp_sizeof_ext(0x03) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "mp_sizeof_ext(0x03)");
  iVar1 = bcmp(str,local_50,3);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x03) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x254,
      "mp_encode_ext(x, 0x03) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x04",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[1] = 0xd6;
  buf[2] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 4),"0x04 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_decode_ext(x, %u))",4);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 4),"0x04 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_decode_strbin(x, %u))",4);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 4);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x04)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "mp_check_ext(mp_encode_ext(x, 0x04))");
  _ok((uint)(d2 == buf + 7),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_decode_ext(x, 0x04)");
  _ok((uint)(d3 == buf + 7),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_next_ext(x, 0x04)");
  _ok((uint)(d4 == buf + 7),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "len(mp_check_ext(x, 0x04)");
  uVar2 = mp_sizeof_ext(4);
  _ok((uint)(uVar2 == 6),"mp_sizeof_ext(0x04) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "mp_sizeof_ext(0x04)");
  _ok((uint)(CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],str[0]))) == (int)*local_50),
      "memcmp(s1, s2, 0x04) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x255,
      "mp_encode_ext(x, 0x04) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x05",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\x05';
  buf[1] = -0x39;
  buf[3] = '\0';
  buf[8] = str[4];
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 5),"0x05 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_decode_ext(x, %u))",5);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 5),"0x05 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_decode_strbin(x, %u))",5);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 5);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x05)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "mp_check_ext(mp_encode_ext(x, 0x05))");
  _ok((uint)(d2 == buf + 9),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_decode_ext(x, 0x05)");
  _ok((uint)(d3 == buf + 9),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_next_ext(x, 0x05)");
  _ok((uint)(d4 == buf + 9),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "len(mp_check_ext(x, 0x05)");
  uVar2 = mp_sizeof_ext(5);
  _ok((uint)(uVar2 == 8),"mp_sizeof_ext(0x05) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "mp_sizeof_ext(0x05)");
  iVar1 = bcmp(str,local_50,5);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x05) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x256,
      "mp_encode_ext(x, 0x05) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x06",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\x06';
  buf[1] = -0x39;
  buf[3] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 6),"0x06 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_decode_ext(x, %u))",6);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 6),"0x06 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_decode_strbin(x, %u))",6);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 6);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x06)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "mp_check_ext(mp_encode_ext(x, 0x06))");
  _ok((uint)(d2 == buf + 10),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_decode_ext(x, 0x06)");
  _ok((uint)(d3 == buf + 10),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_next_ext(x, 0x06)");
  _ok((uint)(d4 == buf + 10),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "len(mp_check_ext(x, 0x06)");
  uVar2 = mp_sizeof_ext(6);
  _ok((uint)(uVar2 == 9),"mp_sizeof_ext(0x06) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "mp_sizeof_ext(0x06)");
  iVar1 = bcmp(str,local_50,6);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x06) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",599,
      "mp_encode_ext(x, 0x06) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x07",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 7; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\a';
  buf[1] = -0x39;
  buf[3] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 7),"0x07 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_decode_ext(x, %u))",7);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 7),"0x07 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_decode_strbin(x, %u))",7);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 7);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x07)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "mp_check_ext(mp_encode_ext(x, 0x07))");
  _ok((uint)(d2 == buf + 0xb),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_decode_ext(x, 0x07)");
  _ok((uint)(d3 == buf + 0xb),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_next_ext(x, 0x07)");
  _ok((uint)(d4 == buf + 0xb),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "len(mp_check_ext(x, 0x07)");
  uVar2 = mp_sizeof_ext(7);
  _ok((uint)(uVar2 == 10),"mp_sizeof_ext(0x07) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "mp_sizeof_ext(0x07)");
  iVar1 = bcmp(str,local_50,7);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x07) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",600,
      "mp_encode_ext(x, 0x07) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x08",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[1] = 0xd7;
  buf[2] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 8),"0x08 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_decode_ext(x, %u))",8);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 8),"0x08 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_decode_strbin(x, %u))",8);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 8);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x08)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "mp_check_ext(mp_encode_ext(x, 0x08))");
  _ok((uint)(d2 == buf + 0xb),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_decode_ext(x, 0x08)");
  _ok((uint)(d3 == buf + 0xb),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_next_ext(x, 0x08)");
  _ok((uint)(d4 == buf + 0xb),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "len(mp_check_ext(x, 0x08)");
  uVar2 = mp_sizeof_ext(8);
  _ok((uint)(uVar2 == 10),"mp_sizeof_ext(0x08) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "mp_sizeof_ext(0x08)");
  _ok((uint)(CONCAT17(str[7],CONCAT16(str[6],CONCAT15(str[5],CONCAT14(str[4],CONCAT13(str[3],
                                                  CONCAT12(str[2],CONCAT11(str[1],str[0]))))))) ==
            *local_50),"memcmp(s1, s2, 0x08) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x259,
      "mp_encode_ext(x, 0x08) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x09",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\t';
  buf[1] = -0x39;
  buf[3] = '\0';
  buf[0xc] = str[8];
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 9),"0x09 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_decode_ext(x, %u))",9);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 9),"0x09 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_decode_strbin(x, %u))",9);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 9);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x09)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "mp_check_ext(mp_encode_ext(x, 0x09))");
  _ok((uint)(d2 == buf + 0xd),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_decode_ext(x, 0x09)");
  _ok((uint)(d3 == buf + 0xd),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_next_ext(x, 0x09)");
  _ok((uint)(d4 == buf + 0xd),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "len(mp_check_ext(x, 0x09)");
  uVar2 = mp_sizeof_ext(9);
  _ok((uint)(uVar2 == 0xc),"mp_sizeof_ext(0x09) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "mp_sizeof_ext(0x09)");
  iVar1 = bcmp(str,local_50,9);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x09) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25a,
      "mp_encode_ext(x, 0x09) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x0a",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\n';
  buf[1] = -0x39;
  buf[3] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 10),"0x0a == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_decode_ext(x, %u))",10);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 10),"0x0a == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_decode_strbin(x, %u))",10);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 10);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x0a)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "mp_check_ext(mp_encode_ext(x, 0x0a))");
  _ok((uint)(d2 == buf + 0xe),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_decode_ext(x, 0x0a)");
  _ok((uint)(d3 == buf + 0xe),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_next_ext(x, 0x0a)");
  _ok((uint)(d4 == buf + 0xe),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "len(mp_check_ext(x, 0x0a)");
  uVar2 = mp_sizeof_ext(10);
  _ok((uint)(uVar2 == 0xd),"mp_sizeof_ext(0x0a) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "mp_sizeof_ext(0x0a)");
  iVar1 = bcmp(str,local_50,10);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x0a) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25b,
      "mp_encode_ext(x, 0x0a) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x0b",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 0xb; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\v';
  buf[1] = -0x39;
  buf[3] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xb),"0x0b == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_decode_ext(x, %u))",0xb);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xb),"0x0b == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_decode_strbin(x, %u))",0xb);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0xb);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x0b)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "mp_check_ext(mp_encode_ext(x, 0x0b))");
  _ok((uint)(d2 == buf + 0xf),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_decode_ext(x, 0x0b)");
  _ok((uint)(d3 == buf + 0xf),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_next_ext(x, 0x0b)");
  _ok((uint)(d4 == buf + 0xf),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "len(mp_check_ext(x, 0x0b)");
  uVar2 = mp_sizeof_ext(0xb);
  _ok((uint)(uVar2 == 0xe),"mp_sizeof_ext(0x0b) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "mp_sizeof_ext(0x0b)");
  iVar1 = bcmp(str,local_50,0xb);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x0b) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25c,
      "mp_encode_ext(x, 0x0b) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x0c",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\f';
  buf[1] = -0x39;
  buf[3] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xc),"0x0c == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_decode_ext(x, %u))",0xc);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xc),"0x0c == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_decode_strbin(x, %u))",0xc);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0xc);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x0c)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "mp_check_ext(mp_encode_ext(x, 0x0c))");
  _ok((uint)(d2 == buf + 0x10),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_decode_ext(x, 0x0c)");
  _ok((uint)(d3 == buf + 0x10),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_next_ext(x, 0x0c)");
  _ok((uint)(d4 == buf + 0x10),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "len(mp_check_ext(x, 0x0c)");
  uVar2 = mp_sizeof_ext(0xc);
  _ok((uint)(uVar2 == 0xf),"mp_sizeof_ext(0x0c) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "mp_sizeof_ext(0x0c)");
  iVar1 = bcmp(str,local_50,0xc);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x0c) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25d,
      "mp_encode_ext(x, 0x0c) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x0d",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 0xd; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\r';
  buf[1] = -0x39;
  buf[3] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xd),"0x0d == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_decode_ext(x, %u))",0xd);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xd),"0x0d == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_decode_strbin(x, %u))",0xd);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0xd);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x0d)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "mp_check_ext(mp_encode_ext(x, 0x0d))");
  _ok((uint)(d2 == buf + 0x11),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_decode_ext(x, 0x0d)");
  _ok((uint)(d3 == buf + 0x11),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_next_ext(x, 0x0d)");
  _ok((uint)(d4 == buf + 0x11),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "len(mp_check_ext(x, 0x0d)");
  uVar2 = mp_sizeof_ext(0xd);
  _ok((uint)(uVar2 == 0x10),"mp_sizeof_ext(0x0d) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "mp_sizeof_ext(0x0d)");
  iVar1 = bcmp(str,local_50,0xd);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x0d) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25e,
      "mp_encode_ext(x, 0x0d) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x0e",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 0xe; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\x0e';
  buf[1] = -0x39;
  buf[3] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xe),"0x0e == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_decode_ext(x, %u))",0xe);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xe),"0x0e == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_decode_strbin(x, %u))",0xe);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0xe);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x0e)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "mp_check_ext(mp_encode_ext(x, 0x0e))");
  _ok((uint)(d2 == buf + 0x12),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_decode_ext(x, 0x0e)");
  _ok((uint)(d3 == buf + 0x12),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_next_ext(x, 0x0e)");
  _ok((uint)(d4 == buf + 0x12),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "len(mp_check_ext(x, 0x0e)");
  uVar2 = mp_sizeof_ext(0xe);
  _ok((uint)(uVar2 == 0x11),"mp_sizeof_ext(0x0e) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "mp_sizeof_ext(0x0e)");
  iVar1 = bcmp(str,local_50,0xe);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x0e) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x25f,
      "mp_encode_ext(x, 0x0e) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x0f",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 0xf; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[2] = '\x0f';
  buf[1] = -0x39;
  buf[3] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xf),"0x0f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_decode_ext(x, %u))",0xf);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xf),"0x0f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_decode_strbin(x, %u))",0xf);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0xf);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x0f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "mp_check_ext(mp_encode_ext(x, 0x0f))");
  _ok((uint)(d2 == buf + 0x13),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_decode_ext(x, 0x0f)");
  _ok((uint)(d3 == buf + 0x13),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_next_ext(x, 0x0f)");
  _ok((uint)(d4 == buf + 0x13),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "len(mp_check_ext(x, 0x0f)");
  uVar2 = mp_sizeof_ext(0xf);
  _ok((uint)(uVar2 == 0x12),"mp_sizeof_ext(0x0f) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "mp_sizeof_ext(0x0f)");
  iVar1 = bcmp(str,local_50,0xf);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x0f) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x260,
      "mp_encode_ext(x, 0x0f) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x10",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[1] = 0xd8;
  buf[2] = '\0';
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x10),"0x10 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_decode_ext(x, %u))",0x10);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x10),"0x10 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_decode_strbin(x, %u))",0x10);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0x10);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x10)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "mp_check_ext(mp_encode_ext(x, 0x10))");
  _ok((uint)(d2 == buf + 0x13),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_decode_ext(x, 0x10)");
  _ok((uint)(d3 == buf + 0x13),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_next_ext(x, 0x10)");
  _ok((uint)(d4 == buf + 0x13),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "len(mp_check_ext(x, 0x10)");
  uVar2 = mp_sizeof_ext(0x10);
  _ok((uint)(uVar2 == 0x12),"mp_sizeof_ext(0x10) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "mp_sizeof_ext(0x10)");
  auVar8[0] = -((char)*local_50 == str[0]);
  auVar8[1] = -(*(char *)((long)local_50 + 1) == str[1]);
  auVar8[2] = -(*(char *)((long)local_50 + 2) == str[2]);
  auVar8[3] = -(*(char *)((long)local_50 + 3) == str[3]);
  auVar8[4] = -(*(char *)((long)local_50 + 4) == str[4]);
  auVar8[5] = -(*(char *)((long)local_50 + 5) == str[5]);
  auVar8[6] = -(*(char *)((long)local_50 + 6) == str[6]);
  auVar8[7] = -(*(char *)((long)local_50 + 7) == str[7]);
  auVar8[8] = -(*(char *)((long)local_50 + 8) == str[8]);
  auVar8[9] = -(*(char *)((long)local_50 + 9) == str[9]);
  auVar8[10] = -(*(char *)((long)local_50 + 10) == str[10]);
  auVar8[0xb] = -(*(char *)((long)local_50 + 0xb) == str[0xb]);
  auVar8[0xc] = -(*(char *)((long)local_50 + 0xc) == str[0xc]);
  auVar8[0xd] = -(*(char *)((long)local_50 + 0xd) == str[0xd]);
  auVar8[0xe] = -(*(char *)((long)local_50 + 0xe) == str[0xe]);
  auVar8[0xf] = -(*(char *)((long)local_50 + 0xf) == str[0xf]);
  _ok((uint)((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff),"memcmp(s1, s2, 0x10) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x261,
      "mp_encode_ext(x, 0x10) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x11",0xc,1,_stdout);
  fputc(10,_stdout);
  for (lVar5 = 0; lVar5 != 0x11; lVar5 = lVar5 + 1) {
    str[lVar5] = (char)lVar5 + 'a';
  }
  ext_type = '\0';
  buf[1] = -0x39;
  buf[2] = '\x11';
  buf[3] = '\0';
  buf[8] = str[4];
  buf[7] = str[3];
  buf[9] = str[5];
  buf[10] = str[6];
  buf[0xb] = str[7];
  buf[0xd] = str[9];
  buf[0xc] = str[8];
  buf[0xe] = str[10];
  buf[0xf] = str[0xb];
  buf[0x10] = str[0xc];
  buf[0x11] = str[0xd];
  buf[0x12] = str[0xe];
  buf[0x13] = str[0xf];
  buf[4] = str[0];
  buf[5] = str[1];
  buf[6] = str[2];
  buf[0x14] = str[0x10];
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x11),"0x11 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_decode_ext(x, %u))",0x11);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x11),"0x11 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_decode_strbin(x, %u))",0x11);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0x11);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x11)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "mp_check_ext(mp_encode_ext(x, 0x11))");
  _ok((uint)(d2 == buf + 0x15),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_decode_ext(x, 0x11)");
  _ok((uint)(d3 == buf + 0x15),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_next_ext(x, 0x11)");
  _ok((uint)(d4 == buf + 0x15),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "len(mp_check_ext(x, 0x11)");
  uVar2 = mp_sizeof_ext(0x11);
  _ok((uint)(uVar2 == 0x14),"mp_sizeof_ext(0x11) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "mp_sizeof_ext(0x11)");
  iVar1 = bcmp(str,local_50,0x11);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x11) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x263,
      "mp_encode_ext(x, 0x11) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0xfe",0xc,1,_stdout);
  fputc(10,_stdout);
  cVar4 = 'a';
  for (lVar5 = 0; lVar5 != 0xfe; lVar5 = lVar5 + 1) {
    str[lVar5] = cVar4 + (char)(((ushort)lVar5 & 0xff) / 0x1a) * -0x1a;
    cVar4 = cVar4 + '\x01';
  }
  ext_type = '\0';
  buf[1] = -0x39;
  buf[2] = -2;
  buf[3] = '\0';
  memcpy(buf + 4,str,0xfe);
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xfe),"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_decode_ext(x, %u))",0xfe);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xfe),"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_decode_strbin(x, %u))",0xfe);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0xfe);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0xfe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "mp_check_ext(mp_encode_ext(x, 0xfe))");
  _ok((uint)(d2 == buf + 0x102),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_decode_ext(x, 0xfe)");
  _ok((uint)(d3 == buf + 0x102),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_next_ext(x, 0xfe)");
  _ok((uint)(d4 == buf + 0x102),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "len(mp_check_ext(x, 0xfe)");
  uVar2 = mp_sizeof_ext(0xfe);
  _ok((uint)(uVar2 == 0x101),"mp_sizeof_ext(0xfe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "mp_sizeof_ext(0xfe)");
  iVar1 = bcmp(str,local_50,0xfe);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0xfe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x264,
      "mp_encode_ext(x, 0xfe) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0xff",0xc,1,_stdout);
  fputc(10,_stdout);
  cVar4 = 'a';
  for (lVar5 = 0; lVar5 != 0xff; lVar5 = lVar5 + 1) {
    str[lVar5] = cVar4 + (char)(((ushort)lVar5 & 0xff) / 0x1a) * -0x1a;
    cVar4 = cVar4 + '\x01';
  }
  ext_type = '\0';
  buf[1] = -0x39;
  buf[2] = -1;
  buf[3] = '\0';
  memcpy(buf + 4,str,0xff);
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xff),"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_decode_ext(x, %u))",0xff);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xff),"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_decode_strbin(x, %u))",0xff);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0xff);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0xff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "mp_check_ext(mp_encode_ext(x, 0xff))");
  _ok((uint)(d2 == buf + 0x103),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_decode_ext(x, 0xff)");
  _ok((uint)(d3 == buf + 0x103),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_next_ext(x, 0xff)");
  _ok((uint)(d4 == buf + 0x103),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "len(mp_check_ext(x, 0xff)");
  uVar2 = mp_sizeof_ext(0xff);
  _ok((uint)(uVar2 == 0x102),"mp_sizeof_ext(0xff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "mp_sizeof_ext(0xff)");
  iVar1 = bcmp(str,local_50,0xff);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0xff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x265,
      "mp_encode_ext(x, 0xff) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x0100",0xe,1,_stdout);
  fputc(10,_stdout);
  cVar4 = 'a';
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    str[lVar5] = cVar4 + (char)(((ushort)lVar5 & 0xff) / 0x1a) * -0x1a;
    cVar4 = cVar4 + '\x01';
  }
  uVar6 = 0;
  ext_type = '\0';
  buf[1] = -0x38;
  buf[2] = '\x01';
  buf[3] = '\0';
  buf[4] = '\0';
  memcpy(buf + 5,str,0x100);
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x100),"0x0100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_decode_ext(x, %u))",0x100);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x100),"0x0100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_decode_strbin(x, %u))",0x100);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0x100);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x0100)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "mp_check_ext(mp_encode_ext(x, 0x0100))");
  _ok((uint)(d2 == buf + 0x105),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_decode_ext(x, 0x0100)");
  _ok((uint)(d3 == buf + 0x105),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_next_ext(x, 0x0100)");
  _ok((uint)(d4 == buf + 0x105),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "len(mp_check_ext(x, 0x0100)");
  uVar2 = mp_sizeof_ext(0x100);
  _ok((uint)(uVar2 == 0x104),"mp_sizeof_ext(0x0100) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "mp_sizeof_ext(0x0100)");
  iVar1 = bcmp(str,local_50,0x100);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x0100) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x267,
      "mp_encode_ext(x, 0x0100) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x0101",0xe,1,_stdout);
  fputc(10,_stdout);
  cVar4 = 'a';
  for (lVar5 = 0; lVar5 != 0x101; lVar5 = lVar5 + 1) {
    str[lVar5] = cVar4 + (char)((uVar6 & 0xffff) / 0x1a) * -0x1a;
    cVar4 = cVar4 + '\x01';
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  ext_type = '\0';
  buf[1] = -0x38;
  buf[2] = '\x01';
  buf[3] = '\x01';
  buf[4] = '\0';
  memcpy(buf + 5,str,0x101);
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x101),"0x0101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_decode_ext(x, %u))",0x101);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x101),"0x0101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_decode_strbin(x, %u))",0x101);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0x101);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x0101)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "mp_check_ext(mp_encode_ext(x, 0x0101))");
  _ok((uint)(d2 == buf + 0x106),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_decode_ext(x, 0x0101)");
  _ok((uint)(d3 == buf + 0x106),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_next_ext(x, 0x0101)");
  _ok((uint)(d4 == buf + 0x106),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "len(mp_check_ext(x, 0x0101)");
  uVar2 = mp_sizeof_ext(0x101);
  _ok((uint)(uVar2 == 0x105),"mp_sizeof_ext(0x0101) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "mp_sizeof_ext(0x0101)");
  iVar1 = bcmp(str,local_50,0x101);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x0101) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x268,
      "mp_encode_ext(x, 0x0101) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0xfffe",0xe,1,_stdout);
  fputc(10,_stdout);
  cVar4 = 'a';
  for (lVar5 = 0; lVar5 != 0xfffe; lVar5 = lVar5 + 1) {
    str[lVar5] = cVar4 + (char)((uVar6 & 0xffff) / 0x1a) * -0x1a;
    cVar4 = cVar4 + '\x01';
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  ext_type = '\0';
  buf[1] = -0x38;
  buf[2] = -1;
  buf[3] = -2;
  buf[4] = '\0';
  memcpy(buf + 5,str,0xfffe);
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xfffe),"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_decode_ext(x, %u))",0xfffe);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xfffe),"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_decode_strbin(x, %u))",0xfffe);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0xfffe);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0xfffe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "mp_check_ext(mp_encode_ext(x, 0xfffe))");
  _ok((uint)(d2 == buf + 0x10003),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_decode_ext(x, 0xfffe)");
  _ok((uint)(d3 == buf + 0x10003),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_next_ext(x, 0xfffe)");
  _ok((uint)(d4 == buf + 0x10003),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "len(mp_check_ext(x, 0xfffe)");
  uVar2 = mp_sizeof_ext(0xfffe);
  _ok((uint)(uVar2 == 0x10002),"mp_sizeof_ext(0xfffe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "mp_sizeof_ext(0xfffe)");
  iVar1 = bcmp(str,local_50,0xfffe);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0xfffe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x269,
      "mp_encode_ext(x, 0xfffe) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0xffff",0xe,1,_stdout);
  fputc(10,_stdout);
  cVar4 = 'a';
  for (lVar5 = 0; lVar5 != 0xffff; lVar5 = lVar5 + 1) {
    str[lVar5] = cVar4 + (char)((uVar6 & 0xffff) / 0x1a) * -0x1a;
    cVar4 = cVar4 + '\x01';
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  ext_type = '\0';
  buf[1] = -0x38;
  buf[2] = -1;
  buf[3] = -1;
  buf[4] = '\0';
  memcpy(buf + 5,str,0xffff);
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xffff),"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_decode_ext(x, %u))",0xffff);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0xffff),"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_decode_strbin(x, %u))",0xffff);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0xffff);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0xffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "mp_check_ext(mp_encode_ext(x, 0xffff))");
  _ok((uint)(d2 == buf + 0x10004),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_decode_ext(x, 0xffff)");
  _ok((uint)(d3 == buf + 0x10004),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_next_ext(x, 0xffff)");
  _ok((uint)(d4 == buf + 0x10004),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "len(mp_check_ext(x, 0xffff)");
  uVar2 = mp_sizeof_ext(0xffff);
  _ok((uint)(uVar2 == 0x10003),"mp_sizeof_ext(0xffff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "mp_sizeof_ext(0xffff)");
  iVar1 = bcmp(str,local_50,0xffff);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0xffff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26a,
      "mp_encode_ext(x, 0xffff) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x00010000",0x12,1,_stdout);
  fputc(10,_stdout);
  cVar4 = 'a';
  for (lVar5 = 0; lVar5 != 0x10000; lVar5 = lVar5 + 1) {
    str[lVar5] = cVar4 + (char)((uVar6 & 0xffff) / 0x1a) * -0x1a;
    cVar4 = cVar4 + '\x01';
    uVar6 = uVar6 + 1;
  }
  ext_type = '\0';
  buf[1] = -0x37;
  buf[2] = '\0';
  buf[3] = '\x01';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  memcpy(buf + 7,str,0x10000);
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x10000),"0x00010000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_decode_ext(x, %u))",0x10000);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x10000),"0x00010000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_decode_strbin(x, %u))",0x10000);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0x10000);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x00010000)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "mp_check_ext(mp_encode_ext(x, 0x00010000))");
  _ok((uint)(d2 == buf + 0x10007),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_decode_ext(x, 0x00010000)");
  _ok((uint)(d3 == buf + 0x10007),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_next_ext(x, 0x00010000)");
  _ok((uint)(d4 == buf + 0x10007),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "len(mp_check_ext(x, 0x00010000)");
  uVar2 = mp_sizeof_ext(0x10000);
  _ok((uint)(uVar2 == 0x10006),"mp_sizeof_ext(0x00010000) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "mp_sizeof_ext(0x00010000)");
  iVar1 = bcmp(str,local_50,0x10000);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x00010000) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26c,
      "mp_encode_ext(x, 0x00010000) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x00010001",0x12,1,_stdout);
  fputc(10,_stdout);
  for (uVar7 = 0; uVar7 != 0x10001; uVar7 = uVar7 + 1) {
    str[uVar7] = (char)((uVar7 & 0xffffffff) / 0x1a) * -0x1a + 'a' + (char)uVar7;
  }
  ext_type = '\0';
  buf[1] = -0x37;
  buf[2] = '\0';
  buf[3] = '\x01';
  buf[4] = '\0';
  buf[5] = '\x01';
  buf[6] = '\0';
  memcpy(buf + 7,str,0x10001);
  d2 = buf + 1;
  local_50 = (long *)mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x10001),"0x00010001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_decode_ext(x, %u))",0x10001);
  _ok((uint)(ext_type == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "type(mp_decode_ext(x))");
  d2 = buf + 1;
  mp_decode_ext(&d2,&ext_type,&len2);
  _ok((uint)(len2 == 0x10001),"0x00010001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_decode_strbin(x, %u))",0x10001);
  d3 = buf + 1;
  mp_next(&d3);
  d4 = buf + 1;
  iVar1 = mp_check(&d4,d3 + 0x10001);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 0x00010001)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "mp_check_ext(mp_encode_ext(x, 0x00010001))");
  _ok((uint)(d2 == buf + 0x10008),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_decode_ext(x, 0x00010001)");
  _ok((uint)(d3 == buf + 0x10008),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_next_ext(x, 0x00010001)");
  _ok((uint)(d4 == buf + 0x10008),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "len(mp_check_ext(x, 0x00010001)");
  uVar2 = mp_sizeof_ext(0x10001);
  _ok((uint)(uVar2 == 0x10007),"mp_sizeof_ext(0x00010001) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "mp_sizeof_ext(0x00010001)");
  iVar1 = bcmp(str,local_50,0x10001);
  _ok((uint)(iVar1 == 0),"memcmp(s1, s2, 0x00010001) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26d,
      "mp_encode_ext(x, 0x00010001) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext_safe",8,1,_stdout);
  fputc(10,_stdout);
  cVar4 = 'a';
  for (lVar5 = 0; lVar5 != 0xfe; lVar5 = lVar5 + 1) {
    str[lVar5] = cVar4 + (char)(((ushort)lVar5 & 0xff) / 0x1a) * -0x1a;
    cVar4 = cVar4 + '\x01';
  }
  d3 = (char *)CONCAT53(d3._3_5_,0xfec7);
  d2 = (char *)0x0;
  pcVar3 = mp_encode_ext_safe((char *)0x0,(ptrdiff_t *)&d2,'\0',str,0xfe);
  _ok((uint)(d2 == (char *)0xfffffffffffffeff),"-sz == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "size after mp_encode_ext_safe(NULL, &sz)");
  _ok((uint)(pcVar3 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "mp_encode_ext_safe(NULL, &sz)");
  d2 = (char *)0x101;
  pcVar3 = mp_encode_ext_safe(buf + 1,(ptrdiff_t *)&d2,'\0',str,0xfe);
  _ok((uint)(d2 == (char *)0x0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "size after mp_encode_ext_safe(buf, &sz)");
  _ok((uint)(pcVar3 == buf + 0x102),"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "len of mp_encode_ext_safe(buf, &sz)");
  iVar1 = bcmp(buf + 1,&d3,3);
  _ok((uint)(iVar1 == 0),"memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "head of mp_encode_ext_safe(buf, &sz)");
  iVar1 = bcmp(buf + 4,str,0xfe);
  _ok((uint)(iVar1 == 0),"memcmp(data + hl, str, (0xfe)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "payload of mp_encode_ext_safe(buf, &sz)");
  d2 = (char *)0x100;
  pcVar3 = mp_encode_ext_safe(buf + 1,(ptrdiff_t *)&d2,'\0',str,0xfe);
  _ok((uint)(d2 == (char *)0xffffffffffffffff),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "size after mp_encode_ext_safe(buf, &sz) overflow");
  _ok((uint)(pcVar3 == buf + 1),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "mp_encode_ext_safe(buf, &sz) overflow");
  buf[1] = -0x39;
  buf[2] = -2;
  buf[3] = '\0';
  memcpy(buf + 4,str,0xfe);
  _ok(1,"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "len of mp_encode_ext_safe(buf, NULL)");
  iVar1 = bcmp(buf + 1,&d3,3);
  _ok((uint)(iVar1 == 0),"memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "head of mp_encode_ext_safe(buf, NULL)");
  iVar1 = bcmp(buf + 4,str,0xfe);
  _ok((uint)(iVar1 == 0),"memcmp(data + hl, str, (0xfe)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x26f,
      "payload of mp_encode_ext_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_exts");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_exts(void)
{
	plan(25*9 + 11);
	header();

	test_ext(0x01);
	test_ext(0x02);
	test_ext(0x03);
	test_ext(0x04);
	test_ext(0x05);
	test_ext(0x06);
	test_ext(0x07);
	test_ext(0x08);
	test_ext(0x09);
	test_ext(0x0a);
	test_ext(0x0b);
	test_ext(0x0c);
	test_ext(0x0d);
	test_ext(0x0e);
	test_ext(0x0f);
	test_ext(0x10);

	test_ext(0x11);
	test_ext(0xfe);
	test_ext(0xff);

	test_ext(0x0100);
	test_ext(0x0101);
	test_ext(0xfffe);
	test_ext(0xffff);

	test_ext(0x00010000);
	test_ext(0x00010001);

	test_ext_safe(0xfe);

	footer();
	return check_plan();
}